

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

size_t fmt::v5::internal::count_code_points(undefined8 param_1,size_t param_2)

{
  size_t sVar1;
  size_t i;
  size_t size;
  char8_t *data;
  
  sVar1 = 0;
  for (i = 0; param_2 != i; i = i + 1) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

FMT_FUNC size_t internal::count_code_points(basic_string_view<char8_t> s) {
  const char8_t *data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80)
      ++num_code_points;
  }
  return num_code_points;
}